

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

QString * __thiscall QFileInfo::absoluteFilePath(QString *__return_storage_ptr__,QFileInfo *this)

{
  QFileInfoPrivate *this_00;
  storage_type *in_RCX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QString local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d.ptr;
  if ((this_00->field_0x1db & 0x40) == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
LAB_00118bb1:
      __stack_chk_fail();
    }
    QFileInfoPrivate::getFileName(__return_storage_ptr__,this_00,AbsoluteName);
  }
  else {
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)"";
    QString::fromLatin1(&local_38,(QString *)0x0,ba);
    (__return_storage_ptr__->d).d = local_38.d.d;
    (__return_storage_ptr__->d).ptr = local_38.d.ptr;
    (__return_storage_ptr__->d).size = local_38.d.size;
    if (*(long *)(in_FS_OFFSET + 0x28) != local_18) goto LAB_00118bb1;
  }
  return __return_storage_ptr__;
}

Assistant:

QString QFileInfo::absoluteFilePath() const
{
    Q_D(const QFileInfo);
    if (d->isDefaultConstructed)
        return ""_L1;
    return d->getFileName(QAbstractFileEngine::AbsoluteName);
}